

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int dict_free(dict_t *d)

{
  int iVar1;
  dictword_t *pdVar2;
  dictword_t *word;
  int i;
  dict_t *d_local;
  
  if (d == (dict_t *)0x0) {
    d_local._4_4_ = 0;
  }
  else {
    iVar1 = d->refcnt + -1;
    d->refcnt = iVar1;
    if (iVar1 < 1) {
      for (word._4_4_ = 0; word._4_4_ < d->n_word; word._4_4_ = word._4_4_ + 1) {
        pdVar2 = d->word + word._4_4_;
        if (pdVar2->word != (char *)0x0) {
          ckd_free(pdVar2->word);
        }
        if (pdVar2->ciphone != (s3cipid_t *)0x0) {
          ckd_free(pdVar2->ciphone);
        }
      }
      if (d->word != (dictword_t *)0x0) {
        ckd_free(d->word);
      }
      if (d->ht != (hash_table_t *)0x0) {
        hash_table_free(d->ht);
      }
      if (d->mdef != (bin_mdef_t *)0x0) {
        bin_mdef_free(d->mdef);
      }
      ckd_free(d);
      d_local._4_4_ = 0;
    }
    else {
      d_local._4_4_ = d->refcnt;
    }
  }
  return d_local._4_4_;
}

Assistant:

int
dict_free(dict_t * d)
{
    int i;
    dictword_t *word;

    if (d == NULL)
        return 0;
    if (--d->refcnt > 0)
        return d->refcnt;

    /* First Step, free all memory allocated for each word */
    for (i = 0; i < d->n_word; i++) {
        word = (dictword_t *) & (d->word[i]);
        if (word->word)
            ckd_free((void *) word->word);
        if (word->ciphone)
            ckd_free((void *) word->ciphone);
    }

    if (d->word)
        ckd_free((void *) d->word);
    if (d->ht)
        hash_table_free(d->ht);
    if (d->mdef)
        bin_mdef_free(d->mdef);
    ckd_free((void *) d);

    return 0;
}